

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

Option * ncnn::get_masked_option(Option *__return_storage_ptr__,Option *opt,int featmask)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  Allocator *pAVar10;
  Allocator *pAVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined3 uVar46;
  int iVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  
  bVar45 = opt->lightmode;
  uVar46 = *(undefined3 *)&opt->field_0x1;
  iVar47 = opt->num_threads;
  pAVar10 = opt->blob_allocator;
  pAVar11 = opt->workspace_allocator;
  iVar27 = opt->openmp_blocktime;
  bVar28 = opt->use_winograd_convolution;
  bVar29 = opt->use_sgemm_convolution;
  bVar30 = opt->use_int8_inference;
  bVar31 = opt->use_vulkan_compute;
  bVar12 = opt->use_fp16_packed;
  bVar13 = opt->use_fp16_storage;
  bVar14 = opt->use_fp16_arithmetic;
  bVar15 = opt->use_int8_packed;
  bVar16 = opt->use_int8_storage;
  bVar17 = opt->use_int8_arithmetic;
  bVar18 = opt->use_packing_layout;
  bVar19 = opt->use_shader_pack8;
  bVar20 = opt->use_subgroup_basic;
  bVar21 = opt->use_subgroup_vote;
  bVar22 = opt->use_subgroup_ballot;
  bVar23 = opt->use_subgroup_shuffle;
  bVar24 = opt->use_image_storage;
  bVar25 = opt->use_tensor_storage;
  bVar26 = opt->use_reserved_0;
  iVar32 = opt->flush_denormals;
  bVar33 = opt->use_local_pool_allocator;
  bVar34 = opt->use_shader_local_memory;
  bVar35 = opt->use_cooperative_matrix;
  bVar36 = opt->use_winograd23_convolution;
  bVar37 = opt->use_winograd43_convolution;
  bVar38 = opt->use_winograd63_convolution;
  bVar39 = opt->use_a53_a55_optimized_kernel;
  bVar40 = opt->use_reserved_7;
  bVar41 = opt->use_reserved_8;
  bVar42 = opt->use_reserved_9;
  bVar43 = opt->use_reserved_10;
  bVar44 = opt->use_reserved_11;
  __return_storage_ptr__->use_bf16_storage = opt->use_bf16_storage;
  __return_storage_ptr__->use_fp16_packed = bVar12;
  __return_storage_ptr__->use_fp16_storage = bVar13;
  __return_storage_ptr__->use_fp16_arithmetic = bVar14;
  __return_storage_ptr__->use_int8_packed = bVar15;
  __return_storage_ptr__->use_int8_storage = bVar16;
  __return_storage_ptr__->use_int8_arithmetic = bVar17;
  __return_storage_ptr__->use_packing_layout = bVar18;
  __return_storage_ptr__->use_shader_pack8 = bVar19;
  __return_storage_ptr__->use_subgroup_basic = bVar20;
  __return_storage_ptr__->use_subgroup_vote = bVar21;
  __return_storage_ptr__->use_subgroup_ballot = bVar22;
  __return_storage_ptr__->use_subgroup_shuffle = bVar23;
  __return_storage_ptr__->use_image_storage = bVar24;
  __return_storage_ptr__->use_tensor_storage = bVar25;
  __return_storage_ptr__->use_reserved_0 = bVar26;
  __return_storage_ptr__->workspace_allocator = pAVar11;
  __return_storage_ptr__->openmp_blocktime = iVar27;
  __return_storage_ptr__->use_winograd_convolution = bVar28;
  __return_storage_ptr__->use_sgemm_convolution = bVar29;
  __return_storage_ptr__->use_int8_inference = bVar30;
  __return_storage_ptr__->use_vulkan_compute = bVar31;
  __return_storage_ptr__->flush_denormals = iVar32;
  __return_storage_ptr__->use_local_pool_allocator = bVar33;
  __return_storage_ptr__->use_shader_local_memory = bVar34;
  __return_storage_ptr__->use_cooperative_matrix = bVar35;
  __return_storage_ptr__->use_winograd23_convolution = bVar36;
  __return_storage_ptr__->use_winograd43_convolution = bVar37;
  __return_storage_ptr__->use_winograd63_convolution = bVar38;
  __return_storage_ptr__->use_a53_a55_optimized_kernel = bVar39;
  __return_storage_ptr__->use_reserved_7 = bVar40;
  __return_storage_ptr__->use_reserved_8 = bVar41;
  __return_storage_ptr__->use_reserved_9 = bVar42;
  __return_storage_ptr__->use_reserved_10 = bVar43;
  __return_storage_ptr__->use_reserved_11 = bVar44;
  __return_storage_ptr__->lightmode = bVar45;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = uVar46;
  __return_storage_ptr__->num_threads = iVar47;
  __return_storage_ptr__->blob_allocator = pAVar10;
  auVar48._0_4_ = -(uint)((featmask & 0x10U) == 0);
  auVar48._4_4_ = -(uint)((featmask & 4U) == 0);
  auVar48._8_4_ = 0xffffffff;
  auVar48._12_4_ = 0xffffffff;
  uVar1._0_1_ = __return_storage_ptr__->use_vulkan_compute;
  uVar1._1_1_ = __return_storage_ptr__->use_bf16_storage;
  uVar1._2_1_ = __return_storage_ptr__->use_fp16_packed;
  uVar1._3_1_ = __return_storage_ptr__->use_fp16_storage;
  uVar1._4_1_ = __return_storage_ptr__->use_fp16_arithmetic;
  uVar1._5_1_ = __return_storage_ptr__->use_int8_packed;
  uVar1._6_1_ = __return_storage_ptr__->use_int8_storage;
  uVar1._7_1_ = __return_storage_ptr__->use_int8_arithmetic;
  auVar57._8_6_ = 0;
  auVar57._0_8_ = uVar1;
  auVar57[0xe] = uVar1._7_1_;
  auVar57[0xf] = uVar1._7_1_;
  auVar56._14_2_ = auVar57._14_2_;
  auVar56._8_5_ = 0;
  auVar56._0_8_ = uVar1;
  auVar56[0xd] = uVar1._6_1_;
  auVar55._13_3_ = auVar56._13_3_;
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55[0xc] = uVar1._6_1_;
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_3_ = 0;
  auVar54._0_8_ = uVar1;
  auVar54[0xb] = uVar1._5_1_;
  auVar53._11_5_ = auVar54._11_5_;
  auVar53._8_2_ = 0;
  auVar53._0_8_ = uVar1;
  auVar53[10] = uVar1._5_1_;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52[8] = 0;
  auVar52._0_8_ = uVar1;
  auVar52[9] = uVar1._4_1_;
  auVar51._9_7_ = auVar52._9_7_;
  auVar51[8] = uVar1._4_1_;
  auVar51._0_8_ = uVar1;
  auVar50._8_8_ = auVar51._8_8_;
  auVar50[7] = uVar1._3_1_;
  auVar50[6] = uVar1._3_1_;
  auVar50[5] = uVar1._2_1_;
  auVar50[4] = uVar1._2_1_;
  auVar50[3] = uVar1._1_1_;
  auVar50[2] = uVar1._1_1_;
  auVar50[1] = (undefined1)uVar1;
  auVar50[0] = (undefined1)uVar1;
  auVar58 = pshuflw(in_XMM4,auVar48,0xe8);
  auVar59._8_8_ = auVar58._8_8_;
  auVar59._0_8_ = auVar58._0_8_ & 0xffff0000ffffffff | (ulong)((featmask & 2U) == 0) << 0x20;
  auVar58._0_4_ = -(uint)((featmask & 1U) == 0);
  auVar58._4_4_ = -(uint)((featmask & 8U) == 0);
  auVar58._8_4_ = -(uint)((featmask & 8U) == 0);
  auVar58._12_4_ = -(uint)((featmask & 8U) == 0);
  auVar58 = pshuflw(auVar58,auVar58,0xa8);
  auVar49 = pshuflw((undefined1  [16])0x0,auVar59,0xa4);
  auVar49._8_8_ = auVar58._0_8_;
  auVar58 = auVar49 & auVar50 & _DAT_004ef680;
  sVar2 = auVar58._0_2_;
  sVar3 = auVar58._2_2_;
  sVar4 = auVar58._4_2_;
  sVar5 = auVar58._6_2_;
  sVar6 = auVar58._8_2_;
  sVar7 = auVar58._10_2_;
  sVar8 = auVar58._12_2_;
  sVar9 = auVar58._14_2_;
  __return_storage_ptr__->use_vulkan_compute =
       (bool)((0 < sVar2) * (sVar2 < 0x100) * auVar58[0] - (0xff < sVar2));
  __return_storage_ptr__->use_bf16_storage =
       (bool)((0 < sVar3) * (sVar3 < 0x100) * auVar58[2] - (0xff < sVar3));
  __return_storage_ptr__->use_fp16_packed =
       (bool)((0 < sVar4) * (sVar4 < 0x100) * auVar58[4] - (0xff < sVar4));
  __return_storage_ptr__->use_fp16_storage =
       (bool)((0 < sVar5) * (sVar5 < 0x100) * auVar58[6] - (0xff < sVar5));
  __return_storage_ptr__->use_fp16_arithmetic =
       (bool)((0 < sVar6) * (sVar6 < 0x100) * auVar58[8] - (0xff < sVar6));
  __return_storage_ptr__->use_int8_packed =
       (bool)((0 < sVar7) * (sVar7 < 0x100) * auVar58[10] - (0xff < sVar7));
  __return_storage_ptr__->use_int8_storage =
       (bool)((0 < sVar8) * (sVar8 < 0x100) * auVar58[0xc] - (0xff < sVar8));
  __return_storage_ptr__->use_int8_arithmetic =
       (bool)((0 < sVar9) * (sVar9 < 0x100) * auVar58[0xe] - (0xff < sVar9));
  __return_storage_ptr__->use_image_storage =
       (bool)(__return_storage_ptr__->use_image_storage & (byte)auVar48._0_4_);
  __return_storage_ptr__->use_tensor_storage =
       (bool)(__return_storage_ptr__->use_tensor_storage & (byte)auVar48._0_4_);
  __return_storage_ptr__->use_sgemm_convolution =
       (bool)(__return_storage_ptr__->use_sgemm_convolution & (featmask & 0x20U) == 0);
  __return_storage_ptr__->use_winograd_convolution =
       (bool)(__return_storage_ptr__->use_winograd_convolution & (featmask & 0x40U) == 0);
  return __return_storage_ptr__;
}

Assistant:

static Option get_masked_option(const Option& opt, int featmask)
{
    // mask option usage as layer specific featmask
    Option opt1 = opt;
    opt1.use_fp16_arithmetic = opt1.use_fp16_arithmetic && !(featmask & (1 << 0));
    opt1.use_fp16_storage = opt1.use_fp16_storage && !(featmask & (1 << 1));
    opt1.use_fp16_packed = opt1.use_fp16_packed && !(featmask & (1 << 1));
    opt1.use_bf16_storage = opt1.use_bf16_storage && !(featmask & (1 << 2));
    opt1.use_int8_packed = opt1.use_int8_packed && !(featmask & (1 << 3));
    opt1.use_int8_storage = opt1.use_int8_storage && !(featmask & (1 << 3));
    opt1.use_int8_arithmetic = opt1.use_int8_arithmetic && !(featmask & (1 << 3));
    opt1.use_vulkan_compute = opt1.use_vulkan_compute && !(featmask & (1 << 4));
    opt1.use_image_storage = opt1.use_image_storage && !(featmask & (1 << 4));
    opt1.use_tensor_storage = opt1.use_tensor_storage && !(featmask & (1 << 4));
    opt1.use_sgemm_convolution = opt1.use_sgemm_convolution && !(featmask & (1 << 5));
    opt1.use_winograd_convolution = opt1.use_winograd_convolution && !(featmask & (1 << 6));

    return opt1;
}